

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O2

void Cbs0_ManCancelUntil(Cbs0_Man_t *p,int iBound)

{
  Gia_Obj_t *pGVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = (p->pProp).iTail;
  if (iVar3 < iBound) {
    __assert_fail("iBound <= p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                  ,0x1aa,"void Cbs0_ManCancelUntil(Cbs0_Man_t *, int)");
  }
  (p->pProp).iHead = iBound;
  for (lVar2 = (long)iBound;
      (lVar2 < iVar3 && (pGVar1 = (p->pProp).pData[lVar2], pGVar1 != (Gia_Obj_t *)0x0));
      lVar2 = lVar2 + 1) {
    if (((uint)*(ulong *)pGVar1 >> 0x1e & 1) == 0) {
      __assert_fail("pVar->fMark0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                    ,0x54,"void Cbs0_VarUnassign(Gia_Obj_t *)");
    }
    *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0xbfffffffbfffffff;
    iVar3 = (p->pProp).iTail;
  }
  (p->pProp).iTail = iBound;
  return;
}

Assistant:

static inline void Cbs0_ManCancelUntil( Cbs0_Man_t * p, int iBound )
{
    Gia_Obj_t * pVar;
    int i;
    assert( iBound <= p->pProp.iTail );
    p->pProp.iHead = iBound;
    Cbs0_QueForEachEntry( p->pProp, pVar, i )
        Cbs0_VarUnassign( pVar );
    p->pProp.iTail = iBound;
}